

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb1Sched.c
# Opt level: O1

int Llb_MtrFindBestColumn(Llb_Mtr_t *p,int iGrpStart)

{
  char cVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  int iVar10;
  ulong uVar11;
  bool bVar12;
  int local_54;
  
  uVar2 = p->nRows;
  uVar3 = uVar2 - p->nFfs;
  if (uVar3 == 0 || (int)uVar2 < p->nFfs) {
    local_54 = -1;
  }
  else {
    iVar8 = -1000000000;
    local_54 = -1;
    uVar11 = 0;
    iVar4 = -1;
    do {
      if (((1 < p->pRowSums[uVar11]) && (p->pProdVars[uVar11] == '\x01')) &&
         (p->pProdNums[uVar11] == 1)) {
        iVar7 = 0;
        bVar12 = false;
        if (iGrpStart < p->nCols + -1) {
          lVar5 = 0;
          do {
            bVar12 = p->pMatrix[iGrpStart + lVar5][uVar11] == '\x01';
            if (bVar12) {
              iVar4 = iGrpStart + (int)lVar5;
            }
            iVar7 = iVar7 + (uint)bVar12;
            lVar5 = lVar5 + 1;
          } while ((long)p->nCols + ~(long)iGrpStart != lVar5);
          bVar12 = iVar7 == 1;
        }
        if (!bVar12) {
          __assert_fail("Counter == 1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/llb/llb1Sched.c"
                        ,0x65,"int Llb_MtrFindBestColumn(Llb_Mtr_t *, int)");
        }
        if ((int)uVar2 < 1) {
          iVar7 = 0;
        }
        else {
          uVar9 = 0;
          iVar7 = 0;
          do {
            cVar1 = p->pProdVars[uVar9];
            iVar10 = iVar7;
            if (((cVar1 == '\x01') && (p->pMatrix[iVar4][uVar9] == '\x01')) &&
               (iVar10 = iVar7 + 2, p->pProdNums[uVar9] != 1)) {
              iVar10 = iVar7;
            }
            iVar7 = iVar10;
            if (cVar1 == '\0') {
              iVar7 = iVar7 - (uint)(p->pMatrix[iVar4][uVar9] == '\x01');
            }
            uVar9 = uVar9 + 1;
          } while (uVar2 != uVar9);
        }
        if (0 < iVar7 && iVar8 < iVar7) {
          local_54 = iVar4;
          iVar8 = iVar7;
        }
      }
      uVar11 = uVar11 + 1;
    } while (uVar11 != uVar3);
  }
  if ((local_54 < 0) && (lVar5 = (long)p->nCols + -1, iGrpStart < (int)lVar5)) {
    lVar6 = (long)iGrpStart;
    iVar8 = 1000000000;
    iVar4 = 1000000000;
    do {
      if ((int)uVar2 < 1) {
        iVar10 = 0;
        iVar7 = 0;
      }
      else {
        uVar11 = 0;
        iVar7 = 0;
        iVar10 = 0;
        do {
          if ((p->pProdVars[uVar11] == '\0') && (p->pMatrix[lVar6][uVar11] == '\x01')) {
            iVar10 = iVar10 + 1;
            iVar7 = iVar7 + p->pProdNums[uVar11];
          }
          uVar11 = uVar11 + 1;
        } while (uVar2 != uVar11);
      }
      if ((iVar10 < iVar4) || ((iVar4 == iVar10 && (iVar8 < iVar7)))) {
        local_54 = (int)lVar6;
        iVar4 = iVar10;
        iVar8 = iVar7;
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 != lVar5);
  }
  return local_54;
}

Assistant:

int Llb_MtrFindBestColumn( Llb_Mtr_t * p, int iGrpStart )
{
    int Cost, Cost2, CostBest = ABC_INFINITY, Cost2Best = ABC_INFINITY;
    int WeightCur, WeightBest = -ABC_INFINITY, iGrp = -1, iGrpBest = -1;
    int k, c, iVar, Counter;
    // find partition that reduces partial product as much as possible
    for ( iVar = 0; iVar < p->nRows - p->nFfs; iVar++ )
    { 
        if ( p->pRowSums[iVar] < 2 )
            continue;
        // look at present variables that can be quantified
        if ( !(p->pProdVars[iVar] == 1 && p->pProdNums[iVar] == 1) )
            continue;
        // check that it appears in one partition only
        Counter = 0;
        for ( c = iGrpStart; c < p->nCols-1; c++ )
            if ( p->pMatrix[c][iVar] == 1 )
            {
                iGrp = c;
                Counter++;
            }
        assert( Counter == 1 );
        if ( Counter != 1 )
            Abc_Print( -1, "Llb_MtrFindBestColumn() Internal error!\n" );
        // find weight of this column
        WeightCur = 0;
        for ( k = 0; k < p->nRows; k++ )
        {
            // increase weight if variable k will be quantified from partial product
            if ( p->pProdVars[k] == 1 && p->pMatrix[iGrp][k] == 1 && p->pProdNums[k] == 1 ) 
                WeightCur += 2;
            // decrease weight if variable k will be added to partial product
            if ( p->pProdVars[k] == 0 && p->pMatrix[iGrp][k] == 1 )
                WeightCur--;
        }
        if ( WeightCur > 0 && WeightBest < WeightCur )
        {
            WeightBest = WeightCur;
            iGrpBest   = iGrp;
        }
    }
    if ( iGrpBest >= 0 )
        return iGrpBest;
    // could not find the group with any vars to quantify
    // select the group that contains as few extra variables as possible
    // if there is a tie, select variables that appear in less groups than others
    for ( iGrp = iGrpStart; iGrp < p->nCols-1; iGrp++ )
    {
        Cost = Cost2 = 0;
        for ( k = 0; k < p->nRows; k++ )
            if ( p->pProdVars[k] == 0 && p->pMatrix[iGrp][k] == 1 )
            {
                Cost++;
                Cost2 += p->pProdNums[k];
            }
        if ( CostBest >  Cost || 
            (CostBest == Cost && Cost2 > Cost2Best) )
        {
            CostBest  = Cost;
            Cost2Best = Cost2;
            iGrpBest  = iGrp;
        }
    }
    return iGrpBest;
}